

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O2

VCameraInfo * __thiscall
ViconDataStreamSDK::Core::VClient::GetCamera(VClient *this,string *i_rCameraName,Enum *o_rResult)

{
  bool bVar1;
  Enum EVar2;
  __normal_iterator<const_ViconCGStream::VCameraInfo_*,_std::vector<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>_>
  __it;
  VCameraInfo *pVVar3;
  long lVar4;
  long lVar5;
  __normal_iterator<const_ViconCGStream::VCameraInfo_*,_std::vector<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>_>
  _Var6;
  string *local_58;
  VCameraInfo *local_50;
  Enum *local_48;
  scoped_lock Lock;
  
  local_48 = o_rResult;
  boost::unique_lock<boost::recursive_mutex>::unique_lock(&Lock,&this->m_FrameMutex);
  __it._M_current =
       (this->m_LatestFrame).m_Cameras.
       super__Vector_base<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_50 = (this->m_LatestFrame).m_Cameras.
             super__Vector_base<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)local_50 - (long)__it._M_current;
  local_58 = i_rCameraName;
  for (lVar4 = lVar5 / 0xa0 >> 2; 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::$_0>
            ::operator()((_Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::__0>
                          *)&local_58,__it);
    _Var6._M_current = __it._M_current;
    if (bVar1) goto LAB_00124d2f;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::$_0>
            ::operator()((_Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::__0>
                          *)&local_58,__it._M_current + 1);
    _Var6._M_current = __it._M_current + 1;
    if (bVar1) goto LAB_00124d2f;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::$_0>
            ::operator()((_Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::__0>
                          *)&local_58,__it._M_current + 2);
    _Var6._M_current = __it._M_current + 2;
    if (bVar1) goto LAB_00124d2f;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::$_0>
            ::operator()((_Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::__0>
                          *)&local_58,__it._M_current + 3);
    _Var6._M_current = __it._M_current + 3;
    if (bVar1) goto LAB_00124d2f;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x280;
  }
  lVar5 = lVar5 / 0xa0;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var6._M_current = local_50;
      if ((lVar5 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::$_0>
                  ::operator()((_Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::__0>
                                *)&local_58,__it), _Var6._M_current = __it._M_current, bVar1))
      goto LAB_00124d2f;
      __it._M_current = __it._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::$_0>
            ::operator()((_Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::__0>
                          *)&local_58,__it);
    _Var6._M_current = __it._M_current;
    if (bVar1) goto LAB_00124d2f;
    __it._M_current = __it._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::$_0>
          ::operator()((_Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::__0>
                        *)&local_58,__it);
  _Var6._M_current = local_50;
  if (bVar1) {
    _Var6._M_current = __it._M_current;
  }
LAB_00124d2f:
  pVVar3 = (VCameraInfo *)0x0;
  EVar2 = InvalidCameraName;
  if (_Var6._M_current !=
      (this->m_LatestFrame).m_Cameras.
      super__Vector_base<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pVVar3 = _Var6._M_current;
    EVar2 = Success;
  }
  *local_48 = EVar2;
  boost::unique_lock<boost::recursive_mutex>::~unique_lock(&Lock);
  return pVVar3;
}

Assistant:

const ViconCGStream::VCameraInfo * VClient::GetCamera( const std::string & i_rCameraName, Result::Enum & o_rResult ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  const auto rCameraIt = 
    std::find_if( m_LatestFrame.m_Cameras.begin(), m_LatestFrame.m_Cameras.end(),
      [&i_rCameraName]( const ViconCGStream::VCameraInfo & rCamera )
        { return AdaptCameraName( rCamera.m_Name, rCamera.m_DisplayType, rCamera.m_CameraID ) == i_rCameraName; }
    );

  if( rCameraIt != m_LatestFrame.m_Cameras.end() )
  {
    o_rResult = Result::Success;
    return &(*rCameraIt);
  }

  o_rResult = Result::InvalidCameraName;
  return nullptr;
}